

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

bool __thiscall
HighsMipSolverData::interruptFromCallbackWithData
          (HighsMipSolverData *this,int callback_type,double mipsolver_objective_value,
          string *message)

{
  HighsCallback *this_00;
  bool bVar1;
  string local_40;
  
  bVar1 = HighsCallback::callbackActive(this->mipsolver->callback_,callback_type);
  if (bVar1) {
    setCallbackDataOut(this,mipsolver_objective_value);
    this_00 = this->mipsolver->callback_;
    std::__cxx11::string::string((string *)&local_40,(string *)message);
    bVar1 = HighsCallback::callbackAction(this_00,callback_type,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool HighsMipSolverData::interruptFromCallbackWithData(
    const int callback_type, const double mipsolver_objective_value,
    const std::string message) const {
  if (!mipsolver.callback_->callbackActive(callback_type)) return false;
  assert(!mipsolver.submip);
  setCallbackDataOut(mipsolver_objective_value);
  return mipsolver.callback_->callbackAction(callback_type, message);
}